

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O2

FT_Error cid_face_init(FT_Stream stream,FT_Face cidface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  ulong *puVar1;
  char cVar2;
  FT_Byte offsize;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  FT_Memory pFVar6;
  unsigned_long uVar7;
  FT_Generic_Finalizer __s1;
  short sVar8;
  FT_Stream pFVar9;
  FT_Stream __s1_00;
  FT_Stream stream_00;
  FT_Face pFVar10;
  char cVar11;
  ushort uVar12;
  FT_Error FVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  void *pvVar17;
  FT_Bitmap_Size **ppFVar18;
  char *pcVar19;
  uint *puVar20;
  FT_ULong FVar21;
  size_t sVar22;
  undefined8 *puVar23;
  FT_Stream pFVar24;
  FT_Pointer pvVar25;
  ulong uVar26;
  uint uVar27;
  FT_CharMap *ppFVar28;
  byte *pbVar29;
  FT_ULong FVar30;
  byte *buffer_00;
  FT_Int FVar31;
  uint uVar32;
  ulong uVar33;
  short sVar34;
  FT_Stream pFVar35;
  FT_String *pFVar36;
  short sVar37;
  long lVar38;
  char *pcVar39;
  T1_FieldRec *pTVar40;
  long lVar41;
  FT_Byte *__s1_01;
  FT_Face pFVar42;
  long *block;
  FT_Byte *buffer_01;
  FT_Stream pFVar43;
  ulong uVar44;
  char *pcVar45;
  uchar *puVar46;
  bool bVar47;
  byte bVar48;
  long lStack_280;
  undefined8 local_278;
  FT_Byte buffer [256];
  FT_Stream local_160;
  FT_Stream local_158;
  FT_Stream local_150;
  int local_148;
  code *local_130;
  code *local_128;
  code *local_120;
  code *local_e0;
  code *local_d8;
  FT_Stream local_d0;
  FT_Stream local_c8;
  uchar *local_c0;
  FT_Stream local_b8;
  ulong local_b0;
  int local_a0;
  undefined8 local_98;
  int local_8c;
  FT_Bitmap_Size **local_88;
  FT_Bitmap_Size **local_80;
  FT_Bitmap_Size **local_78;
  FT_Bitmap_Size **local_70;
  FT_Memory local_68;
  uint *local_60;
  FT_Stream local_58;
  FT_Stream local_50;
  FT_Face local_48;
  FT_Error local_3c;
  FT_Int local_38;
  FT_Error error;
  
  bVar48 = 0;
  cidface->num_faces = 1;
  if (cidface[1].face_index == 0) {
    pvVar17 = FT_Get_Module_Interface((cidface->driver->root).library,"psaux");
    if (pvVar17 == (void *)0x0) {
      return 0xb;
    }
    cidface[1].face_index = (FT_Long)pvVar17;
  }
  if (cidface[2].bbox.yMin == 0) {
    pvVar17 = FT_Get_Module_Interface((cidface->driver->root).library,"pshinter");
    cidface[2].bbox.yMin = (FT_Pos)pvVar17;
  }
  FVar13 = FT_Stream_Seek(stream,0);
  if (FVar13 != 0) {
    return FVar13;
  }
  pFVar6 = cidface->memory;
  local_98 = 0;
  pFVar24 = cidface->stream;
  lVar41 = cidface[1].face_index;
  local_38 = face_index;
  memset(&local_160,0,200);
  (*(code *)**(undefined8 **)(lVar41 + 8))(&local_160,0,0,pFVar6);
  local_d0 = pFVar24;
  ppFVar18 = (FT_Bitmap_Size **)FT_Stream_Pos(pFVar24);
  iVar14 = FT_Stream_EnterFrame(pFVar24,0x1f);
  pFVar42 = cidface;
  FVar31 = local_38;
  local_48 = cidface;
  if (iVar14 == 0) {
    iVar15 = strncmp((char *)pFVar24->cursor,"%!PS-Adobe-3.0 Resource-CIDFont",0x1f);
    FT_Stream_ExitFrame(pFVar24);
    pFVar42 = local_48;
    FVar31 = local_38;
    iVar14 = 2;
    if (iVar15 == 0) {
      local_78 = (FT_Bitmap_Size **)-(long)ppFVar18;
      local_70 = ppFVar18;
      local_68 = pFVar6;
      local_50 = pFVar24;
LAB_001fd6fa:
      pFVar24 = local_50;
      puVar20 = (uint *)FT_Stream_Pos(local_50);
      uVar33 = 0x109;
      buffer_01 = (FT_Byte *)&local_278;
      local_58 = (FT_Stream)0x0;
      while( true ) {
        uVar7 = pFVar24->size;
        FVar21 = FT_Stream_Pos(pFVar24);
        uVar44 = uVar7 - FVar21;
        if (uVar33 < uVar44) {
          uVar44 = uVar33;
        }
        iVar14 = FT_Stream_Read(pFVar24,buffer_01,uVar44);
        pFVar42 = local_48;
        FVar31 = local_38;
        if (iVar14 != 0) break;
        buffer_01[uVar44] = '\0';
        local_60 = puVar20;
        for (__s1_01 = (FT_Byte *)&local_278; __s1_01 < buffer_01 + uVar44 + -6;
            __s1_01 = __s1_01 + 1) {
          if ((*__s1_01 == 'S') && (iVar14 = strncmp((char *)__s1_01,"StartData",9), iVar14 == 0)) {
            lStack_280 = 10;
LAB_001fd800:
            pFVar24 = local_50;
            iVar14 = FT_Stream_Seek(local_50,(FT_ULong)local_70);
            pFVar42 = local_48;
            FVar31 = local_38;
            if (iVar14 != 0) goto LAB_001fd5fb;
            pFVar35 = (FT_Stream)(lStack_280 + (long)puVar20);
            puVar46 = (uchar *)((long)local_78 + (long)pFVar35);
            iVar14 = FT_Stream_ExtractFrame(pFVar24,(FT_ULong)puVar46,(FT_Byte **)&local_c8);
            pFVar24 = local_c8;
            pFVar42 = local_48;
            FVar31 = local_38;
            if (iVar14 != 0) goto LAB_001fd5fb;
            local_158 = local_c8;
            local_160 = local_c8;
            local_150 = (FT_Stream)
                        ((uchar *)(lStack_280 + (long)local_78) + (long)puVar20 + (long)local_c8);
            local_a0 = -1;
            local_c0 = puVar46;
            local_b8 = pFVar35;
            local_58 = pFVar35;
            (*local_120)(&local_160);
            (*local_128)(&local_160);
            pFVar43 = local_160;
            (*local_120)(&local_160);
            (*local_128)(&local_160);
            pFVar35 = local_150 + -1;
            pFVar9 = local_150 + -1;
            goto LAB_001fd8c0;
          }
          if ((__s1_01[1] == 's') && (iVar14 = strncmp((char *)__s1_01,"/sfnts",6), iVar14 == 0)) {
            lStack_280 = 7;
            goto LAB_001fd800;
          }
          puVar20 = (uint *)((long)puVar20 + 1);
        }
        if ((uchar *)((long)&local_58->base + uVar44) < (uchar *)0x9) goto LAB_001fdf2b;
        local_278 = *(FT_Bitmap_Size ***)(buffer_01 + (uVar44 - 9));
        buffer[0] = buffer_01[uVar44 - 1];
        puVar20 = local_60 + 0x40;
        uVar33 = 0x100;
        buffer_01 = buffer + 1;
        local_58 = (FT_Stream)0x9;
        pFVar24 = local_50;
      }
    }
  }
LAB_001fd5fb:
  error = iVar14;
  if (local_c8 != (FT_Stream)0x0) {
    FT_Stream_ReleaseFrame(local_d0,(FT_Byte **)&local_c8);
  }
  (*local_130)();
  if (-1 < FVar31 && error == 0) {
    if ((short)FVar31 == 0) {
      pFVar42->num_glyphs = (FT_Long)pFVar42[2].available_sizes;
      pFVar42->num_charmaps = 0;
      pFVar42->face_index = 0;
      uVar33 = pFVar42->face_flags;
      pFVar42->face_flags = uVar33 | 0x811;
      if ((char)pFVar42[1].bbox.yMin != '\0') {
        pFVar42->face_flags = uVar33 | 0x815;
      }
      pcVar19 = (char *)pFVar42[1].generic.data;
      pFVar42->family_name = pcVar19;
      pFVar42->style_name = "Regular";
      if (pcVar19 == (char *)0x0) {
        if ((FT_String *)pFVar42[1].face_flags != (FT_String *)0x0) {
          pFVar42->family_name = (FT_String *)pFVar42[1].face_flags;
        }
      }
      else {
        ppFVar28 = pFVar42[1].charmaps;
        if (ppFVar28 != (FT_CharMap *)0x0) {
          do {
            cVar11 = *(char *)ppFVar28;
            while( true ) {
              if (cVar11 == '\0') goto LAB_001fd990;
              cVar2 = *pcVar19;
              if (cVar11 == cVar2) break;
              if ((cVar11 == ' ') || (cVar11 == '-')) goto LAB_001fd6e2;
              if ((cVar2 != ' ') && (cVar2 != '-')) {
                if (cVar2 == '\0') {
                  pFVar42->style_name = (FT_String *)ppFVar28;
                }
                goto LAB_001fd990;
              }
              pcVar19 = pcVar19 + 1;
            }
            pcVar19 = pcVar19 + 1;
LAB_001fd6e2:
            ppFVar28 = (FT_CharMap *)((long)ppFVar28 + 1);
          } while( true );
        }
      }
LAB_001fd990:
      uVar33 = (ulong)(pFVar42[1].bbox.xMin != 0);
      pFVar42->style_flags = uVar33;
      __s1 = pFVar42[1].generic.finalizer;
      if ((__s1 != (FT_Generic_Finalizer)0x0) &&
         ((iVar14 = strcmp((char *)__s1,"Bold"), iVar14 == 0 ||
          (iVar14 = strcmp((char *)__s1,"Black"), iVar14 == 0)))) {
        pFVar42->style_flags = uVar33 | 2;
      }
      pFVar42->num_fixed_sizes = 0;
      pFVar42->available_sizes = (FT_Bitmap_Size *)0x0;
      (pFVar42->bbox).xMin = pFVar42[1].bbox.xMax >> 0x10;
      lVar41 = pFVar42[1].bbox.yMax;
      (pFVar42->bbox).yMin = lVar41 >> 0x10;
      (pFVar42->bbox).xMax = *(long *)&pFVar42[1].units_per_EM + 0xffff >> 0x10;
      lVar38 = *(long *)&pFVar42[1].max_advance_width + 0xffff;
      (pFVar42->bbox).yMax = lVar38 >> 0x10;
      uVar12 = pFVar42->units_per_EM;
      if (uVar12 == 0) {
        pFVar42->units_per_EM = 1000;
        uVar12 = 1000;
      }
      sVar37 = (short)((ulong)lVar38 >> 0x10);
      pFVar42->ascender = sVar37;
      sVar34 = (short)((ulong)lVar41 >> 0x10);
      pFVar42->descender = sVar34;
      error = 0;
      sVar8 = (short)((ulong)((uint)uVar12 * 0xc) / 10);
      iVar14 = (int)sVar37 - (int)sVar34;
      sVar34 = (short)iVar14;
      if (iVar14 <= sVar8) {
        sVar34 = sVar8;
      }
      pFVar42->height = sVar34;
      uVar3 = *(undefined4 *)((long)&pFVar42[1].bbox.yMin + 2);
      pFVar42->underline_position = (short)uVar3;
      pFVar42->underline_thickness = (short)((uint)uVar3 >> 0x10);
    }
    else {
      error = 6;
    }
  }
  return error;
LAB_001fd8c0:
  stream_00 = local_50;
  __s1_00 = local_160;
  if ((FT_Stream)((long)&pFVar35->limit + 2U) < local_160) goto LAB_001fd94a;
  pFVar42 = local_48;
  FVar31 = local_38;
  iVar14 = local_148;
  if (local_148 != 0) goto LAB_001fd5fb;
  if ((local_160 <= (FT_Stream)((long)&pFVar9->cursor + 7) && *(uchar *)&local_160->base == 'S') &&
     (iVar14 = strncmp((char *)local_160,"StartData",9), iVar14 == 0)) {
    iVar14 = strncmp((char *)pFVar24,"(Hex)",5);
    pFVar42 = local_48;
    uVar33 = local_b0;
    if ((iVar14 == 0) && (uVar33 = strtol((char *)pFVar43,(char **)0x0,10), (long)uVar33 < 0))
    goto LAB_001fdf2b;
    local_b0 = uVar33;
    error = 0;
    local_150 = (FT_Stream)(local_c0 + (long)&local_c8->base);
    local_148 = 0;
    local_58 = (FT_Stream)(local_c0 + (long)local_c8 + -0x12);
    local_78 = (FT_Bitmap_Size **)&pFVar42[1].face_flags;
    local_70 = (FT_Bitmap_Size **)&pFVar42[1].bbox.xMax;
    local_88 = (FT_Bitmap_Size **)&pFVar42[2].generic.finalizer;
    local_80 = &pFVar42[1].available_sizes;
    pFVar24 = local_c8;
    pFVar35 = local_150;
    local_50 = local_150;
    goto LAB_001fdb39;
  }
  if ((*(uchar *)((long)&__s1_00->base + 1) == 's') &&
     (iVar14 = strncmp((char *)__s1_00,"/sfnts",6), iVar14 == 0)) {
    pFVar42 = local_48;
    FVar31 = local_38;
    iVar14 = 2;
    goto LAB_001fd5fb;
  }
  (*local_120)(&local_160);
  (*local_128)(&local_160);
  pFVar24 = pFVar43;
  pFVar43 = __s1_00;
  goto LAB_001fd8c0;
LAB_001fd94a:
  FT_Stream_ReleaseFrame(local_50,(FT_Byte **)&local_c8);
  iVar14 = FT_Stream_Seek(stream_00,(FT_ULong)local_58);
  pFVar42 = local_48;
  FVar31 = local_38;
  if (iVar14 != 0) goto LAB_001fd5fb;
  goto LAB_001fd6fa;
LAB_001fdb39:
  local_160 = pFVar24;
  (*local_128)(&local_160);
  pFVar9 = local_160;
  iVar14 = local_a0;
  pFVar43 = (FT_Stream)((long)&local_160[-1].memory + 7);
  if (pFVar35 <= local_160) {
    pFVar43 = local_58;
  }
  for (; pFVar35 = local_50, pFVar24 < pFVar43; pFVar24 = (FT_Stream)((long)&pFVar24->base + 1)) {
    if (((*(uchar *)&pFVar24->base == '%') &&
        (iVar15 = strncmp((char *)pFVar24,"%ADOBeginFontDict",0x11), iVar15 == 0)) &&
       (0 < pFVar42[2].num_charmaps)) {
      iVar14 = iVar14 + 1;
      local_a0 = iVar14;
    }
  }
  if (((pFVar9 < local_50) && ((*local_120)(&local_160), pFVar24 = local_160, local_160 < pFVar35))
     && (local_148 == 0)) {
    if ((FT_Stream)((long)&pFVar9->base + 2U) < pFVar35 && *(uchar *)&pFVar9->base == '/') {
      puVar20 = (uint *)((long)&pFVar9->base + 1);
      if ((int)((long)local_160 - (long)puVar20) - 1U < 0x15) {
        uVar33 = (long)local_160 - (long)puVar20 & 0xffffffff;
        local_60 = puVar20;
        for (pTVar40 = cid_field_records; pcVar19 = pTVar40->ident, pFVar42 = local_48,
            pFVar35 = local_50, pcVar19 != (char *)0x0; pTVar40 = pTVar40 + 1) {
          if (((char)*puVar20 == *pcVar19) &&
             (sVar22 = strlen(pcVar19), FVar31 = local_38, pFVar42 = local_48, pFVar35 = local_50,
             puVar20 = local_60, uVar33 == sVar22)) {
            uVar44 = 1;
            do {
              if (uVar33 <= uVar44) {
                if (pTVar40->type == T1_FIELD_TYPE_CALLBACK) {
                  (*pTVar40->reader)(local_48,&local_160);
                  pFVar35 = local_50;
                  FVar31 = local_38;
                }
                else {
                  ppFVar18 = local_78;
                  switch(pTVar40->location) {
                  case T1_FIELD_LOCATION_CID_INFO:
                    break;
                  default:
                    if (((long)local_a0 < 0) || (local_48[2].num_charmaps <= local_a0)) {
                      local_148 = 0xa0;
                      iVar14 = 0xa0;
                      goto LAB_001fdd6a;
                    }
                    ppFVar18 = (FT_Bitmap_Size **)(local_48[2].charmaps + (long)local_a0 * 0x2a);
                    break;
                  case T1_FIELD_LOCATION_FONT_EXTRA:
                    ppFVar18 = local_88;
                    break;
                  case T1_FIELD_LOCATION_FONT_INFO:
                    ppFVar18 = local_80;
                    break;
                  case T1_FIELD_LOCATION_BBOX:
                    ppFVar18 = local_70;
                  }
                  local_278 = ppFVar18;
                  if (pTVar40->type - T1_FIELD_TYPE_INTEGER_ARRAY < 2) {
                    local_148 = (*local_d8)();
                  }
                  else {
                    local_148 = (*local_e0)(&local_160,pTVar40,&local_278,0);
                  }
                }
                pFVar24 = local_160;
                iVar14 = local_148;
                if (local_148 == 0) goto LAB_001fdb39;
                goto LAB_001fdd6a;
              }
              lVar41 = uVar44 + 1;
              puVar46 = (uchar *)(pcVar19 + uVar44);
              uVar44 = uVar44 + 1;
            } while (*(uchar *)((long)&pFVar9->base + lVar41) == *puVar46);
          }
        }
      }
    }
    goto LAB_001fdb39;
  }
  FVar31 = local_38;
  iVar14 = 3;
  if (pFVar42[2].num_charmaps != 0) {
    iVar14 = local_148;
  }
LAB_001fdd6a:
  if ((FVar31 < 0) || (iVar14 != 0)) goto LAB_001fd5fb;
  error = iVar14;
  puVar23 = (undefined8 *)ft_mem_alloc(local_68,0x50,&error);
  pFVar42[2].bbox.yMax = (FT_Pos)puVar23;
  iVar14 = error;
  if (error != 0) goto LAB_001fd5fb;
  if (local_b0 == 0) {
    pFVar35 = pFVar42->stream;
    for (lVar41 = 10; pFVar24 = local_b8, lVar41 != 0; lVar41 = lVar41 + -1) {
      *puVar23 = pFVar35->base;
      pFVar35 = (FT_Stream)((long)pFVar35 + (ulong)bVar48 * -0x10 + 8);
      puVar23 = puVar23 + (ulong)bVar48 * -2 + 1;
    }
  }
  else {
    uVar33 = pFVar42->stream->size - (long)local_b8;
    if (uVar33 < local_b0) {
      local_b0 = uVar33;
    }
    pcVar19 = (char *)ft_mem_alloc(local_68,local_b0,&error);
    uVar33 = local_b0;
    pFVar42[2].bbox.xMax = (FT_Pos)pcVar19;
    iVar14 = error;
    if (error != 0) goto LAB_001fd5fb;
    pFVar24 = pFVar42->stream;
    iVar14 = FT_Stream_Seek(pFVar24,(FT_ULong)local_b8);
    pFVar42 = local_48;
    if (iVar14 != 0) goto LAB_001fd5fb;
    local_50 = (FT_Stream)CONCAT71(local_50._1_7_,1);
    pbVar29 = (byte *)&local_278;
    buffer_00 = pbVar29;
    pcVar45 = pcVar19;
    while (pcVar45 < pcVar19 + uVar33) {
      while( true ) {
        if (pbVar29 <= buffer_00) {
          FVar21 = FT_Stream_Pos(pFVar24);
          FVar30 = pFVar24->size - FVar21;
          if (FVar30 == 0) {
            pFVar42 = local_48;
            FVar31 = local_38;
            iVar14 = 0xa0;
            goto LAB_001fd5fb;
          }
          if (0xff < FVar30) {
            FVar30 = 0x100;
          }
          buffer_00 = (byte *)&local_278;
          iVar14 = FT_Stream_Read(pFVar24,buffer_00,FVar30);
          pFVar42 = local_48;
          FVar31 = local_38;
          if (iVar14 != 0) goto LAB_001fd5fb;
          FVar30 = FT_Stream_Pos(pFVar24);
          pbVar29 = buffer + (FVar30 - FVar21) + -8;
          FVar31 = local_38;
        }
        bVar48 = *buffer_00;
        uVar16 = bVar48 - 0x30;
        if (uVar16 < 10) {
          bVar47 = true;
          goto LAB_001fdee6;
        }
        uVar16 = bVar48 - 0x61;
        bVar47 = (byte)uVar16 < 6;
        if (bVar47) goto LAB_001fdee6;
        if ((byte)(bVar48 + 0xbf) < 6) {
          bVar47 = true;
          uVar16 = (uint)(byte)(bVar48 - 0x37);
          goto LAB_001fdee6;
        }
        uVar16 = (uint)bVar48;
        pFVar42 = local_48;
        iVar14 = 0xa0;
        if (0x3e < uVar16) goto LAB_001fd5fb;
        if ((0x100003601U >> ((ulong)uVar16 & 0x3f) & 1) == 0) break;
        buffer_00 = buffer_00 + 1;
      }
      if ((ulong)uVar16 != 0x3e) goto LAB_001fd5fb;
      uVar16 = 0;
LAB_001fdee6:
      if ((char)local_50 == '\0') {
        cVar11 = (char)uVar16 + *pcVar45;
        pcVar39 = pcVar45 + 1;
      }
      else {
        cVar11 = (char)uVar16 << 4;
        pcVar39 = pcVar45;
      }
      *pcVar45 = cVar11;
      if (!bVar47) break;
      buffer_00 = buffer_00 + 1;
      local_50 = (FT_Stream)CONCAT71(local_50._1_7_,'\x01' - (char)local_50);
      pcVar45 = pcVar39;
    }
    pFVar42 = local_48;
    error = 0;
    FT_Stream_OpenMemory((FT_Stream)local_48[2].bbox.yMax,(FT_Byte *)local_48[2].bbox.xMax,local_b0)
    ;
    pFVar24 = (FT_Stream)0x0;
  }
  pFVar10 = local_48;
  pFVar42[2].generic.data = pFVar24;
  uVar16 = pFVar42[2].num_fixed_sizes;
  if ((((int)uVar16 < 0) || (uVar32 = *(uint *)&pFVar42[2].field_0x3c, (int)uVar32 < 1)) ||
     (4 < uVar16 || 4 < uVar32)) {
    error = 3;
    iVar14 = error;
    goto LAB_001fd5fb;
  }
  pFVar35 = (FT_Stream)pFVar42[2].bbox.yMax;
  pFVar36 = (FT_String *)(pFVar35->size - (long)pFVar24);
  uVar27 = pFVar42[2].num_charmaps;
  lVar41 = 0;
  uVar33 = 0;
  if (0 < (int)uVar27) {
    uVar33 = (ulong)uVar27;
  }
  for (; FVar31 = local_38, uVar33 * 0x150 - lVar41 != 0; lVar41 = lVar41 + 0x150) {
    ppFVar28 = pFVar42[2].charmaps;
    uVar4 = *(uint *)((long)ppFVar28 + lVar41 + 0x148);
    if ((long)(int)uVar4 < 0) {
LAB_001fe020:
      error = 3;
      iVar14 = error;
      goto LAB_001fd5fb;
    }
    uVar5 = *(uint *)((long)ppFVar28 + lVar41 + 0x138);
    if ((((uVar4 == 0) && (uVar5 != 0)) ||
        ((4 < uVar4 ||
         ((puVar1 = (ulong *)((long)ppFVar28 + lVar41 + 0x140), pFVar36 < (FT_String *)*puVar1 ||
          ((int)uVar5 < 0)))))) ||
       ((uVar4 != 0 && (((long)pFVar36 - *puVar1) / (ulong)(long)(int)uVar4 < (ulong)uVar5))))
    goto LAB_001fe020;
  }
  if ((pFVar36 < pFVar42[2].style_name) ||
     ((FT_Bitmap_Size *)
      ((ulong)((long)pFVar36 - (long)pFVar42[2].style_name) / (ulong)(uVar32 + uVar16)) <
      local_48[2].available_sizes)) {
    error = 3;
    pFVar42 = local_48;
    iVar14 = error;
    goto LAB_001fd5fb;
  }
  local_58 = (FT_Stream)local_48->memory;
  local_78 = (FT_Bitmap_Size **)local_48[1].face_index;
  local_68 = (FT_Memory)0x0;
  local_60 = (uint *)ft_mem_realloc((FT_Memory)local_58,0x10,0,(long)(int)uVar27,(void *)0x0,
                                    &local_3c);
  pFVar10[2].bbox.xMin = (FT_Pos)local_60;
  block = (long *)0x0;
  if (local_3c == 0) {
    local_50 = (FT_Stream)0x8;
    block = (long *)0x0;
    for (local_70 = (FT_Bitmap_Size **)0x0; (long)local_70 < (long)local_48[2].num_charmaps;
        local_70 = (FT_Bitmap_Size **)((long)local_70 + 1)) {
      ppFVar28 = local_48[2].charmaps;
      local_88 = (FT_Bitmap_Size **)((long)local_70 * 0x150);
      uVar16 = *(uint *)(ppFVar28 + 0x27 + (long)local_70 * 0x2a);
      uVar33 = (ulong)uVar16;
      if (uVar33 != 0) {
        local_8c = *(int *)((long)ppFVar28 + 4 + (long)local_88);
        local_80 = (FT_Bitmap_Size **)CONCAT44(local_80._4_4_,uVar16 + 1);
        if ((uint)local_68 < uVar16 + 1) {
          uVar32 = (uVar16 & 0xfffffffc) + 4;
          if ((uint)local_68 < uVar32) {
            block = (long *)ft_mem_realloc((FT_Memory)local_58,8,(ulong)local_68 & 0xffffffff,
                                           (ulong)uVar32,block,&local_3c);
            if (local_3c == 0) {
              local_68 = (FT_Memory)(ulong)uVar32;
              goto LAB_001fe18e;
            }
          }
          else {
            local_3c = 0xa0;
          }
        }
        else {
LAB_001fe18e:
          puVar46 = (uchar *)((long)ppFVar28 + (long)local_88);
          local_3c = FT_Stream_Seek(pFVar35,*(long *)(puVar46 + 0x140) +
                                            (long)local_48[2].generic.data);
          if (local_3c == 0) {
            local_3c = FT_Stream_EnterFrame
                                 (pFVar35,(ulong)(uint)(*(int *)(puVar46 + 0x148) * (int)local_80));
            if (local_3c == 0) {
              local_278 = (FT_Bitmap_Size **)pFVar35->cursor;
              offsize = puVar46[0x148];
              for (uVar32 = 0; uVar32 <= uVar16; uVar32 = uVar32 + 1) {
                FVar21 = cid_get_offset((FT_Byte **)&local_278,offsize);
                block[uVar32] = FVar21;
              }
              FT_Stream_ExitFrame(pFVar35);
              uVar32 = 1;
              while (uVar32 <= uVar16) {
                uVar27 = uVar32 - 1;
                uVar44 = (ulong)uVar32;
                uVar32 = uVar32 + 1;
                if ((ulong)block[uVar44] < (ulong)block[uVar27]) goto LAB_001fe35f;
              }
              if (pFVar35->size - (long)local_48[2].generic.data < (ulong)block[uVar33]) {
LAB_001fe35f:
                local_3c = 3;
              }
              else {
                FVar21 = block[uVar33] - *block;
                uVar44 = (ulong)local_80 & 0xffffffff;
                pvVar25 = ft_mem_realloc((FT_Memory)local_58,8,0,uVar44,(void *)0x0,&local_3c);
                *(FT_Pointer *)(local_60 + 2) = pvVar25;
                if (local_3c == 0) {
                  pvVar25 = ft_mem_alloc((FT_Memory)local_58,FVar21,&local_3c);
                  **(undefined8 **)(local_60 + 2) = pvVar25;
                  if (((local_3c == 0) &&
                      (local_3c = FT_Stream_Seek(pFVar35,*block + (long)local_48[2].generic.data),
                      local_3c == 0)) &&
                     (local_3c = FT_Stream_Read(pFVar35,(FT_Byte *)**(undefined8 **)(local_60 + 2),
                                                FVar21), local_3c == 0)) {
                    for (uVar26 = 1; uVar44 != uVar26; uVar26 = uVar26 + 1) {
                      *(long *)(*(long *)(local_60 + 2) + uVar26 * 8) =
                           (block[uVar26] - block[uVar26 - 1]) +
                           *(long *)(*(long *)(local_60 + 2) + -8 + uVar26 * 8);
                    }
                    if (-1 < local_8c) {
                      for (uVar44 = 0; uVar33 != uVar44; uVar44 = uVar44 + 1) {
                        (*(code *)local_78[4])(*(void **)(*(long *)(local_60 + 2) + uVar44 * 8));
                      }
                    }
                    *local_60 = uVar16;
                    goto LAB_001fe351;
                  }
                }
              }
            }
          }
        }
        pvVar17 = (void *)local_48[2].bbox.xMin;
        if (pvVar17 != (void *)0x0) {
          for (lVar41 = 0; lVar41 < local_48[2].num_charmaps; lVar41 = lVar41 + 1) {
            if (*(undefined8 **)((long)pvVar17 + (long)local_50) == (undefined8 *)0x0) {
              pvVar17 = (void *)0x0;
            }
            else {
              ft_mem_free((FT_Memory)local_58,
                          (void *)**(undefined8 **)((long)pvVar17 + (long)local_50));
              **(undefined8 **)((long)&local_50->base + local_48[2].bbox.xMin) = 0;
              pvVar17 = *(void **)((long)&local_50->base + local_48[2].bbox.xMin);
            }
            ft_mem_free((FT_Memory)local_58,pvVar17);
            pvVar17 = (void *)local_48[2].bbox.xMin;
            puVar46 = (uchar *)((long)pvVar17 + (long)local_50);
            puVar46[0] = '\0';
            puVar46[1] = '\0';
            puVar46[2] = '\0';
            puVar46[3] = '\0';
            puVar46[4] = '\0';
            puVar46[5] = '\0';
            puVar46[6] = '\0';
            puVar46[7] = '\0';
            local_50 = (FT_Stream)&local_50->pos;
          }
          ft_mem_free((FT_Memory)local_58,pvVar17);
          local_48[2].bbox.xMin = 0;
        }
        break;
      }
LAB_001fe351:
      local_60 = local_60 + 4;
    }
  }
  ft_mem_free((FT_Memory)local_58,block);
  pFVar42 = local_48;
  FVar31 = local_38;
  iVar14 = local_3c;
  goto LAB_001fd5fb;
LAB_001fdf2b:
  pFVar42 = local_48;
  FVar31 = local_38;
  iVar14 = 3;
  goto LAB_001fd5fb;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_face_init( FT_Stream      stream,
                 FT_Face        cidface,        /* CID_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    CID_Face          face = (CID_Face)cidface;
    FT_Error          error;
    PSAux_Service     psaux;
    PSHinter_Service  pshinter;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    cidface->num_faces = 1;

    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      psaux = (PSAux_Service)FT_Get_Module_Interface(
                FT_FACE_LIBRARY( face ), "psaux" );

      if ( !psaux )
      {
        FT_ERROR(( "cid_face_init: cannot access `psaux' module\n" ));
        error = FT_THROW( Missing_Module );
        goto Exit;
      }

      face->psaux = psaux;
    }

    pshinter = (PSHinter_Service)face->pshinter;
    if ( !pshinter )
    {
      pshinter = (PSHinter_Service)FT_Get_Module_Interface(
                   FT_FACE_LIBRARY( face ), "pshinter" );

      face->pshinter = pshinter;
    }

    FT_TRACE2(( "CID driver\n" ));

    /* open the tokenizer; this will also check the font format */
    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    error = cid_face_open( face, face_index );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    /* XXX: handle CID fonts with more than a single face */
    if ( ( face_index & 0xFFFF ) != 0 )
    {
      FT_ERROR(( "cid_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      CID_FaceInfo  cid  = &face->cid;
      PS_FontInfo   info = &cid->font_info;


      cidface->num_glyphs   = (FT_Long)cid->cid_count;
      cidface->num_charmaps = 0;

      cidface->face_index = face_index & 0xFFFF;

      cidface->face_flags |= FT_FACE_FLAG_SCALABLE   | /* scalable outlines */
                             FT_FACE_FLAG_HORIZONTAL | /* horizontal data   */
                             FT_FACE_FLAG_HINTER;      /* has native hinter */

      if ( info->is_fixed_pitch )
        cidface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* XXX: TODO: add kerning with .afm support */

      /* get style name -- be careful, some broken fonts only */
      /* have a /FontName dictionary entry!                   */
      cidface->family_name = info->family_name;
      /* assume "Regular" style if we don't know better */
      cidface->style_name = (char *)"Regular";
      if ( cidface->family_name )
      {
        char*  full   = info->full_name;
        char*  family = cidface->family_name;


        if ( full )
        {
          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                if ( !*family )
                  cidface->style_name = full;
                break;
              }
            }
          }
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( cid->cid_font_name )
          cidface->family_name = cid->cid_font_name;
      }

      /* compute style flags */
      cidface->style_flags = 0;
      if ( info->italic_angle )
        cidface->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          cidface->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      cidface->num_fixed_sizes = 0;
      cidface->available_sizes = NULL;

      cidface->bbox.xMin =   cid->font_bbox.xMin            >> 16;
      cidface->bbox.yMin =   cid->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      cidface->bbox.xMax = ( cid->font_bbox.xMax + 0xFFFF ) >> 16;
      cidface->bbox.yMax = ( cid->font_bbox.yMax + 0xFFFF ) >> 16;

      if ( !cidface->units_per_EM )
        cidface->units_per_EM = 1000;

      cidface->ascender  = (FT_Short)( cidface->bbox.yMax );
      cidface->descender = (FT_Short)( cidface->bbox.yMin );

      cidface->height = (FT_Short)( ( cidface->units_per_EM * 12 ) / 10 );
      if ( cidface->height < cidface->ascender - cidface->descender )
        cidface->height = (FT_Short)( cidface->ascender - cidface->descender );

      cidface->underline_position  = (FT_Short)info->underline_position;
      cidface->underline_thickness = (FT_Short)info->underline_thickness;
    }

  Exit:
    return error;
  }